

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_257,_true,_embree::avx512::VirtualCurveIntersectorK<4>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray,
              TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  bool bVar7;
  undefined8 uVar8;
  long lVar9;
  undefined1 auVar10 [16];
  char cVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong *puVar18;
  ulong *puVar19;
  ulong uVar20;
  byte bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  vint4 bi;
  undefined1 auVar41 [16];
  vint4 bi_1;
  undefined1 auVar42 [16];
  vint4 bi_2;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vint4 ai_2;
  undefined1 auVar45 [16];
  vint4 ai_1;
  undefined1 auVar46 [16];
  vint4 ai;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  NodeRef stack [244];
  size_t local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar51._4_4_ = uVar1;
  auVar51._0_4_ = uVar1;
  auVar51._8_4_ = uVar1;
  auVar51._12_4_ = uVar1;
  auVar22 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar23 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar1 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uVar2 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar3 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar6 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar24 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar4 * 0.99999964)));
  auVar25 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar5 * 0.99999964)));
  auVar26 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar6 * 0.99999964)));
  auVar27 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar4 * 1.0000004)));
  auVar28 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar5 * 1.0000004)));
  auVar29 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar6 * 1.0000004)));
  uVar16 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  auVar30 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar31 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  puVar19 = local_7d0;
LAB_01cdf136:
  puVar18 = puVar19;
  if (puVar18 == &local_7d8) {
LAB_01cdf4ef:
    return puVar18 != &local_7d8;
  }
  puVar19 = puVar18 + -1;
  uVar15 = puVar18[-1];
LAB_01cdf14a:
  if ((uVar15 & 0xf) == 0) {
    auVar32 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x20 + uVar16),auVar51);
    auVar32 = vmulps_avx512vl(auVar24,auVar32);
    auVar33 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar15 + 0x20 + uVar20),auVar22);
    auVar33 = vmulps_avx512vl(auVar25,auVar33);
    auVar32 = vmaxps_avx(auVar32,auVar33);
    auVar33 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar15 + 0x20 + uVar17),auVar23);
    auVar34 = vmulps_avx512vl(auVar26,auVar33);
    auVar33 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x20 + (uVar16 ^ 0x10)),auVar51);
    auVar33 = vmulps_avx512vl(auVar27,auVar33);
    auVar35 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar15 + 0x20 + (uVar20 ^ 0x10)),auVar22);
    auVar35 = vmulps_avx512vl(auVar28,auVar35);
    auVar33 = vminps_avx(auVar33,auVar35);
    auVar35 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar15 + 0x20 + (uVar17 ^ 0x10)),auVar23);
    auVar35 = vmulps_avx512vl(auVar29,auVar35);
    auVar34 = vmaxps_avx512vl(auVar34,auVar30);
    auVar32 = vmaxps_avx(auVar32,auVar34);
    auVar34 = vminps_avx512vl(auVar35,auVar31);
    auVar33 = vminps_avx(auVar33,auVar34);
    uVar8 = vcmpps_avx512vl(auVar32,auVar33,2);
    bVar21 = (byte)uVar8;
  }
  else {
    if ((int)(uVar15 & 0xf) != 2) {
      cVar11 = (**(code **)((long)This->leafIntersector +
                           (ulong)*(byte *)(uVar15 & 0xfffffffffffffff0) * 0x40 + 0x18))
                         (pre,ray,k,context);
      if (cVar11 != '\0') {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        goto LAB_01cdf4ef;
      }
      goto LAB_01cdf136;
    }
    uVar14 = uVar15 & 0xfffffffffffffff0;
    auVar32 = *(undefined1 (*) [16])(uVar14 + 0x80);
    auVar35._0_4_ = fVar3 * auVar32._0_4_;
    auVar35._4_4_ = fVar3 * auVar32._4_4_;
    auVar35._8_4_ = fVar3 * auVar32._8_4_;
    auVar35._12_4_ = fVar3 * auVar32._12_4_;
    auVar33 = *(undefined1 (*) [16])(uVar14 + 0x90);
    auVar38._0_4_ = fVar3 * auVar33._0_4_;
    auVar38._4_4_ = fVar3 * auVar33._4_4_;
    auVar38._8_4_ = fVar3 * auVar33._8_4_;
    auVar38._12_4_ = fVar3 * auVar33._12_4_;
    auVar34 = *(undefined1 (*) [16])(uVar14 + 0xa0);
    auVar43._0_4_ = fVar3 * auVar34._0_4_;
    auVar43._4_4_ = fVar3 * auVar34._4_4_;
    auVar43._8_4_ = fVar3 * auVar34._8_4_;
    auVar43._12_4_ = fVar3 * auVar34._12_4_;
    auVar39._4_4_ = uVar2;
    auVar39._0_4_ = uVar2;
    auVar39._8_4_ = uVar2;
    auVar39._12_4_ = uVar2;
    auVar35 = vfmadd231ps_fma(auVar35,auVar39,*(undefined1 (*) [16])(uVar14 + 0x50));
    auVar38 = vfmadd231ps_fma(auVar38,auVar39,*(undefined1 (*) [16])(uVar14 + 0x60));
    auVar39 = vfmadd231ps_fma(auVar43,auVar39,*(undefined1 (*) [16])(uVar14 + 0x70));
    auVar10._4_4_ = uVar1;
    auVar10._0_4_ = uVar1;
    auVar10._8_4_ = uVar1;
    auVar10._12_4_ = uVar1;
    auVar40 = vfmadd231ps_fma(auVar35,auVar10,*(undefined1 (*) [16])(uVar14 + 0x20));
    auVar38 = vfmadd231ps_fma(auVar38,auVar10,*(undefined1 (*) [16])(uVar14 + 0x30));
    auVar39 = vfmadd231ps_fma(auVar39,auVar10,*(undefined1 (*) [16])(uVar14 + 0x40));
    auVar48._8_4_ = 0x7fffffff;
    auVar48._0_8_ = 0x7fffffff7fffffff;
    auVar48._12_4_ = 0x7fffffff;
    auVar35 = vandps_avx(auVar48,auVar40);
    auVar50._8_4_ = 0x219392ef;
    auVar50._0_8_ = 0x219392ef219392ef;
    auVar50._12_4_ = 0x219392ef;
    uVar12 = vcmpps_avx512vl(auVar35,auVar50,1);
    bVar7 = (bool)((byte)uVar12 & 1);
    auVar36._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar40._0_4_;
    bVar7 = (bool)((byte)(uVar12 >> 1) & 1);
    auVar36._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar40._4_4_;
    bVar7 = (bool)((byte)(uVar12 >> 2) & 1);
    auVar36._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar40._8_4_;
    bVar7 = (bool)((byte)(uVar12 >> 3) & 1);
    auVar36._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar40._12_4_;
    auVar35 = vandps_avx(auVar48,auVar38);
    uVar12 = vcmpps_avx512vl(auVar35,auVar50,1);
    bVar7 = (bool)((byte)uVar12 & 1);
    auVar40._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar38._0_4_;
    bVar7 = (bool)((byte)(uVar12 >> 1) & 1);
    auVar40._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar38._4_4_;
    bVar7 = (bool)((byte)(uVar12 >> 2) & 1);
    auVar40._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar38._8_4_;
    bVar7 = (bool)((byte)(uVar12 >> 3) & 1);
    auVar40._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar38._12_4_;
    auVar35 = vandps_avx(auVar48,auVar39);
    uVar12 = vcmpps_avx512vl(auVar35,auVar50,1);
    bVar7 = (bool)((byte)uVar12 & 1);
    auVar37._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar39._0_4_;
    bVar7 = (bool)((byte)(uVar12 >> 1) & 1);
    auVar37._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar39._4_4_;
    bVar7 = (bool)((byte)(uVar12 >> 2) & 1);
    auVar37._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar39._8_4_;
    bVar7 = (bool)((byte)(uVar12 >> 3) & 1);
    auVar37._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar39._12_4_;
    auVar38 = vrcp14ps_avx512vl(auVar36);
    auVar49._8_4_ = 0x3f800000;
    auVar49._0_8_ = 0x3f8000003f800000;
    auVar49._12_4_ = 0x3f800000;
    auVar35 = vfnmadd213ps_fma(auVar36,auVar38,auVar49);
    auVar35 = vfmadd132ps_fma(auVar35,auVar38,auVar38);
    auVar39 = vrcp14ps_avx512vl(auVar40);
    auVar38 = vfnmadd213ps_fma(auVar40,auVar39,auVar49);
    auVar38 = vfmadd132ps_fma(auVar38,auVar39,auVar39);
    auVar40 = vrcp14ps_avx512vl(auVar37);
    auVar39 = vfnmadd213ps_fma(auVar37,auVar40,auVar49);
    auVar39 = vfmadd132ps_fma(auVar39,auVar40,auVar40);
    auVar32 = vfmadd213ps_avx512vl(auVar32,auVar23,*(undefined1 (*) [16])(uVar14 + 0xb0));
    auVar33 = vfmadd213ps_avx512vl(auVar33,auVar23,*(undefined1 (*) [16])(uVar14 + 0xc0));
    auVar34 = vfmadd213ps_avx512vl(auVar34,auVar23,*(undefined1 (*) [16])(uVar14 + 0xd0));
    auVar32 = vfmadd231ps_avx512vl(auVar32,auVar22,*(undefined1 (*) [16])(uVar14 + 0x50));
    auVar33 = vfmadd231ps_avx512vl(auVar33,auVar22,*(undefined1 (*) [16])(uVar14 + 0x60));
    auVar34 = vfmadd231ps_avx512vl(auVar34,auVar22,*(undefined1 (*) [16])(uVar14 + 0x70));
    auVar32 = vfmadd231ps_fma(auVar32,auVar51,*(undefined1 (*) [16])(uVar14 + 0x20));
    auVar47._0_4_ = -auVar35._0_4_ * auVar32._0_4_;
    auVar47._4_4_ = -auVar35._4_4_ * auVar32._4_4_;
    auVar47._8_4_ = -auVar35._8_4_ * auVar32._8_4_;
    auVar47._12_4_ = -auVar35._12_4_ * auVar32._12_4_;
    auVar32 = vfmadd231ps_fma(auVar33,auVar51,*(undefined1 (*) [16])(uVar14 + 0x30));
    auVar46._0_4_ = -auVar38._0_4_ * auVar32._0_4_;
    auVar46._4_4_ = -auVar38._4_4_ * auVar32._4_4_;
    auVar46._8_4_ = -auVar38._8_4_ * auVar32._8_4_;
    auVar46._12_4_ = -auVar38._12_4_ * auVar32._12_4_;
    auVar32 = vfmadd231ps_fma(auVar34,auVar51,*(undefined1 (*) [16])(uVar14 + 0x40));
    auVar45._0_4_ = -auVar39._0_4_ * auVar32._0_4_;
    auVar45._4_4_ = -auVar39._4_4_ * auVar32._4_4_;
    auVar45._8_4_ = -auVar39._8_4_ * auVar32._8_4_;
    auVar45._12_4_ = -auVar39._12_4_ * auVar32._12_4_;
    auVar41._0_4_ = auVar35._0_4_ + auVar47._0_4_;
    auVar41._4_4_ = auVar35._4_4_ + auVar47._4_4_;
    auVar41._8_4_ = auVar35._8_4_ + auVar47._8_4_;
    auVar41._12_4_ = auVar35._12_4_ + auVar47._12_4_;
    auVar42._0_4_ = auVar38._0_4_ + auVar46._0_4_;
    auVar42._4_4_ = auVar38._4_4_ + auVar46._4_4_;
    auVar42._8_4_ = auVar38._8_4_ + auVar46._8_4_;
    auVar42._12_4_ = auVar38._12_4_ + auVar46._12_4_;
    auVar44._0_4_ = auVar39._0_4_ + auVar45._0_4_;
    auVar44._4_4_ = auVar39._4_4_ + auVar45._4_4_;
    auVar44._8_4_ = auVar39._8_4_ + auVar45._8_4_;
    auVar44._12_4_ = auVar39._12_4_ + auVar45._12_4_;
    auVar38 = vpminsd_avx(auVar47,auVar41);
    auVar32 = vpminsd_avx(auVar46,auVar42);
    auVar33 = vpminsd_avx(auVar45,auVar44);
    auVar32 = vmaxps_avx(auVar32,auVar33);
    auVar34 = vpmaxsd_avx(auVar47,auVar41);
    auVar33 = vpmaxsd_avx(auVar46,auVar42);
    auVar35 = vpmaxsd_avx(auVar45,auVar44);
    auVar33 = vminps_avx(auVar33,auVar35);
    auVar35 = vmaxps_avx512vl(auVar30,auVar38);
    auVar32 = vmaxps_avx(auVar35,auVar32);
    auVar34 = vminps_avx512vl(auVar31,auVar34);
    auVar33 = vminps_avx(auVar34,auVar33);
    auVar34._8_4_ = 0x3f7ffffa;
    auVar34._0_8_ = 0x3f7ffffa3f7ffffa;
    auVar34._12_4_ = 0x3f7ffffa;
    auVar34 = vmulps_avx512vl(auVar32,auVar34);
    auVar32._8_4_ = 0x3f800003;
    auVar32._0_8_ = 0x3f8000033f800003;
    auVar32._12_4_ = 0x3f800003;
    auVar32 = vmulps_avx512vl(auVar33,auVar32);
    uVar8 = vcmpps_avx512vl(auVar34,auVar32,2);
    bVar21 = (byte)uVar8;
  }
  bVar21 = bVar21 & 0xf;
  if (bVar21 == 0) goto LAB_01cdf136;
  uVar12 = uVar15 & 0xfffffffffffffff0;
  lVar9 = 0;
  for (uVar15 = (ulong)bVar21; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
    lVar9 = lVar9 + 1;
  }
  uVar15 = *(ulong *)(uVar12 + lVar9 * 8);
  uVar13 = bVar21 - 1 & (uint)bVar21;
  uVar14 = (ulong)uVar13;
  if (uVar13 != 0) {
    do {
      *puVar19 = uVar15;
      puVar19 = puVar19 + 1;
      lVar9 = 0;
      for (uVar15 = uVar14; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
        lVar9 = lVar9 + 1;
      }
      uVar14 = uVar14 - 1 & uVar14;
      uVar15 = *(ulong *)(uVar12 + lVar9 * 8);
    } while (uVar14 != 0);
  }
  goto LAB_01cdf14a;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }